

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O0

void Bmc_CexCarePropagateFwd(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vPriosIn,Vec_Int_t *vPriosFf)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_40;
  int ValueMax;
  int f;
  int i;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObjRo;
  Vec_Int_t *vPriosFf_local;
  Vec_Int_t *vPriosIn_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  uVar1 = Abc_Var2Lit(pCex->nPis * (pCex->iFrame + 1),0);
  pGVar3 = Gia_ManConst0(p);
  pGVar3->Value = uVar1;
  ValueMax = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum(p);
    bVar4 = false;
    if (ValueMax < iVar2) {
      iVar2 = Gia_ManPoNum(p);
      _f = Gia_ManCo(p,iVar2 + ValueMax);
      bVar4 = _f != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    _f->Value = uVar1;
    ValueMax = ValueMax + 1;
  }
  Vec_IntClear(vPriosFf);
  for (local_40 = 0; local_40 <= pCex->iFrame; local_40 = local_40 + 1) {
    ValueMax = 0;
    while( true ) {
      iVar2 = Gia_ManRegNum(p);
      bVar4 = false;
      if (ValueMax < iVar2) {
        iVar2 = Gia_ManPoNum(p);
        _f = Gia_ManCo(p,iVar2 + ValueMax);
        bVar4 = false;
        if (_f != (Gia_Obj_t *)0x0) {
          iVar2 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar2 + ValueMax);
          bVar4 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar4) break;
      uVar1 = _f->Value;
      pObjRi->Value = uVar1;
      Vec_IntPush(vPriosFf,uVar1);
      ValueMax = ValueMax + 1;
    }
    Bmc_CexCarePropagateFwdOne(p,pCex,local_40,vPriosIn);
  }
  return;
}

Assistant:

void Bmc_CexCarePropagateFwd( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vPriosIn, Vec_Int_t * vPriosFf )
{
    Gia_Obj_t * pObjRo, * pObjRi;
    int i, f, ValueMax = Abc_Var2Lit( pCex->nPis * (pCex->iFrame + 1), 0 );
    Gia_ManConst0( p )->Value = ValueMax;
    Gia_ManForEachRi( p, pObjRi, i )
        pObjRi->Value = ValueMax;
    Vec_IntClear( vPriosFf );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            Vec_IntPush( vPriosFf, (pObjRo->Value = pObjRi->Value) );
        Bmc_CexCarePropagateFwdOne( p, pCex, f, vPriosIn );
    }
}